

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O0

bool Gps2Mjd(SATTIME GPST,MJDTIME *MJD)

{
  SATTIME GPST_00;
  double DayofLeapSec;
  int LeapSec;
  bool flag;
  MJDTIME *MJD_local;
  SATTIME GPST_local;
  
  GPST_00.SOW = GPST.SOW;
  GPST_00.Week = GPST.Week;
  GPST_00._4_4_ = 0;
  GPST_local.SOW._7_1_ = isLegal(GPST_00);
  if (GPST_local.SOW._7_1_) {
    MJD->Day = GPST_00.Week * 7 + 0xacd4;
    MJD->FracDay = (((GPST_00.SOW + 19.0) / 86400.0 + 44244.0 + (double)(int)(GPST_00.Week * 7)) -
                   0.00042824074074074075) - (double)MJD->Day;
    if (1.0 <= MJD->FracDay) {
      MJD->Day = (int)MJD->FracDay + MJD->Day;
      MJD->FracDay = MJD->FracDay - (double)(int)MJD->FracDay;
    }
    GPST_local.SOW._7_1_ = true;
  }
  return GPST_local.SOW._7_1_;
}

Assistant:

bool Gps2Mjd(const SATTIME GPST, MJDTIME &MJD)
{
    bool flag = isLegal(GPST);
    if(!flag)
        return flag;
    int LeapSec = 37;
    double DayofLeapSec = 37.0 / 24.0 / 3600.0;

    MJD.Day = GPST.Week * 7 + 44244;
    MJD.FracDay = (GPST.SOW + 19) / 86400.0 + 44244 + GPST.Week * 7 - DayofLeapSec - MJD.Day;
    if(MJD.FracDay >= 1)
    {
        MJD.Day += int(MJD.FracDay);
        MJD.FracDay -= int(MJD.FracDay);
    }

    return true;
}